

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseInfo::TestCaseInfo(TestCaseInfo *this,TestCaseInfo *other)

{
  ITestCase *pIVar1;
  
  pIVar1 = (other->m_test).m_p;
  (this->m_test).m_p = pIVar1;
  if (pIVar1 != (ITestCase *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  std::__cxx11::string::string((string *)&this->m_className,(string *)&other->m_className);
  std::__cxx11::string::string((string *)&this->m_name,(string *)&other->m_name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)&other->m_description);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->m_tags)._M_t,&(other->m_tags)._M_t);
  SourceLineInfo::SourceLineInfo(&this->m_lineInfo,&other->m_lineInfo);
  this->m_isHidden = other->m_isHidden;
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( const TestCaseInfo& other )
    :   m_test( other.m_test ),
        m_className( other.m_className ),
        m_name( other.m_name ),
        m_description( other.m_description ),
        m_tags( other.m_tags ),
        m_lineInfo( other.m_lineInfo ),
        m_isHidden( other.m_isHidden )
    {}